

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  char *pcVar1;
  ImFont **ppIVar2;
  ImFont *pIVar3;
  ImFontConfig *pIVar4;
  ImFontAtlasCustomRect *ptr;
  uint uVar5;
  ulong uVar6;
  ImFontConfig *pIVar7;
  long lVar8;
  long lVar9;
  
  if (this->Locked != false) {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui_draw.cpp"
                  ,0x5e9,"void ImFontAtlas::ClearInputData()");
  }
  uVar5 = (this->ConfigData).Size;
  uVar6 = (ulong)uVar5;
  if (0 < (int)uVar5) {
    pIVar7 = (this->ConfigData).Data;
    lVar8 = 0;
    lVar9 = 0;
    do {
      if ((*(void **)(pIVar7->Name + lVar8 + -0x56) != (void *)0x0) &&
         (pIVar7->Name[lVar8 + -0x4a] == '\x01')) {
        ImGui::MemFree(*(void **)(pIVar7->Name + lVar8 + -0x56));
        uVar6 = (ulong)(this->ConfigData).Size;
        if ((long)uVar6 <= lVar9) {
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                        ,0x4e6,"T &ImVector<ImFontConfig>::operator[](int) [T = ImFontConfig]");
        }
        pIVar7 = (this->ConfigData).Data;
        pcVar1 = pIVar7->Name + lVar8 + -0x56;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
      }
      lVar9 = lVar9 + 1;
      uVar5 = (uint)uVar6;
      lVar8 = lVar8 + 0x88;
    } while (lVar9 < (int)uVar5);
  }
  lVar8 = (long)(this->Fonts).Size;
  if (lVar8 < 1) {
    pIVar7 = (this->ConfigData).Data;
  }
  else {
    ppIVar2 = (this->Fonts).Data;
    pIVar7 = (this->ConfigData).Data;
    lVar9 = 0;
    do {
      pIVar3 = ppIVar2[lVar9];
      pIVar4 = pIVar3->ConfigData;
      if ((pIVar7 <= pIVar4) && (pIVar4 < pIVar7 + (int)uVar5)) {
        pIVar3->ConfigData = (ImFontConfig *)0x0;
        ppIVar2[lVar9]->ConfigDataCount = 0;
      }
      lVar9 = lVar9 + 1;
    } while (lVar8 != lVar9);
  }
  if (pIVar7 != (ImFontConfig *)0x0) {
    (this->ConfigData).Size = 0;
    (this->ConfigData).Capacity = 0;
    ImGui::MemFree(pIVar7);
    (this->ConfigData).Data = (ImFontConfig *)0x0;
  }
  ptr = (this->CustomRects).Data;
  if (ptr != (ImFontAtlasCustomRect *)0x0) {
    (this->CustomRects).Size = 0;
    (this->CustomRects).Capacity = 0;
    ImGui::MemFree(ptr);
    (this->CustomRects).Data = (ImFontAtlasCustomRect *)0x0;
  }
  this->CustomRectIds[0] = -1;
  return;
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (int i = 0; i < ConfigData.Size; i++)
        if (ConfigData[i].FontData && ConfigData[i].FontDataOwnedByAtlas)
        {
            IM_FREE(ConfigData[i].FontData);
            ConfigData[i].FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (int i = 0; i < Fonts.Size; i++)
        if (Fonts[i]->ConfigData >= ConfigData.Data && Fonts[i]->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            Fonts[i]->ConfigData = NULL;
            Fonts[i]->ConfigDataCount = 0;
        }
    ConfigData.clear();
    CustomRects.clear();
    for (int n = 0; n < IM_ARRAYSIZE(CustomRectIds); n++)
        CustomRectIds[n] = -1;
}